

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateVar
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,Var v,uint32 n)

{
  bool bVar1;
  indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *this_00;
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  uint32 end_1;
  uint32 end;
  undefined4 in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffac;
  Solver *in_stack_ffffffffffffffb0;
  undefined4 local_14;
  
  bVar1 = Solver::validVar(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_14 = in_EDX;
  if (bVar1) {
    this_00 = (indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *)(in_RDI + 8)
    ;
    DomScore::DomScore((DomScore *)this_00,
                       (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    growVecTo<bk_lib::pod_vector<Clasp::DomScore,std::allocator<Clasp::DomScore>>>
              ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)this_00,
               in_stack_ffffffffffffffac,(value_type *)0x23b861);
    growVecTo<bk_lib::pod_vector<int,std::allocator<int>>>
              ((pod_vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffac,
               (value_type_conflict3 *)0x23b884);
    for (; local_14 != in_EDX + in_ECX; local_14 = local_14 + 1) {
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::update
                (this_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  else {
    for (; local_14 != in_EDX + in_ECX; local_14 = local_14 + 1) {
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::remove
                ((indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *)
                 (in_RDI + 0x28),(char *)(ulong)local_14);
    }
  }
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateVar(const Solver& s, Var v, uint32 n) {
	if (s.validVar(v)) {
		growVecTo(score_, v+n);
		growVecTo(occ_, v+n);
		for (uint32 end = v+n; v != end; ++v) { vars_.update(v); }
	}
	else {
		for (uint32 end = v+n; v != end; ++v) { vars_.remove(v); }
	}
}